

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

bool __thiscall FIX::DataDictionary::isMsgField(DataDictionary *this,string *msgType,int field)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  int field_local;
  string *msgType_local;
  DataDictionary *this_local;
  
  i._M_node._4_4_ = field;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)(this + 0x68),msgType);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              *)(this + 0x68));
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->(&local_30);
    local_40._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   (&ppVar2->second,(key_type_conflict *)((long)&i._M_node + 4));
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->(&local_30);
    local_48._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&ppVar2->second);
    this_local._7_1_ = std::operator!=(&local_40,&local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool isMsgField(const std::string &msgType, int field) const {
    MsgTypeToField::const_iterator i = m_messageFields.find(msgType);
    if (i == m_messageFields.end()) {
      return false;
    }
    return i->second.find(field) != i->second.end();
  }